

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

iterator __thiscall
trompeloeil::list<trompeloeil::call_matcher_base<int_&(int_&)>,_trompeloeil::ignore_disposer>::
push_back(list<trompeloeil::call_matcher_base<int_&(int_&)>,_trompeloeil::ignore_disposer> *this,
         call_matcher_base<int_&(int_&)> *t)

{
  call_matcher_base<int_&(int_&)> *t_local;
  list<trompeloeil::call_matcher_base<int_&(int_&)>,_trompeloeil::ignore_disposer> *this_local;
  
  list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_>::invariant_check
            (&this->super_list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_>);
  (t->super_list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_>).prev =
       (this->super_list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_>).prev;
  (t->super_list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_>).next =
       &this->super_list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_>;
  ((this->super_list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_>).prev)->next =
       &t->super_list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_>;
  (this->super_list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_>).prev =
       &t->super_list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_>;
  list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_>::invariant_check
            (&this->super_list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_>);
  iterator::iterator((iterator *)&this_local,
                     &t->super_list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_>);
  return (iterator)&this_local->super_list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_>;
}

Assistant:

auto
  list<T, Disposer>::push_back(
    T* t)
  noexcept
  -> iterator
  {
    invariant_check();
    t->prev = prev;
    t->next = this;
    prev->next = t;
    prev = t;
    invariant_check();
    return iterator{t};
  }